

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_strauss_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  long lVar1;
  secp256k1_gej *a;
  secp256k1_scalar *na;
  secp256k1_fe *psVar2;
  secp256k1_ge *psVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  int iVar7;
  secp256k1_scalar *psVar8;
  undefined1 auVar9 [16];
  secp256k1_strauss_state state;
  secp256k1_ge point;
  size_t local_d0;
  secp256k1_strauss_state local_a0;
  secp256k1_ge local_88;
  
  lVar1 = 0;
  do {
    iVar4 = (uint)scratch->magic[lVar1] - (uint)(byte)"scratch"[lVar1];
    if (scratch->magic[lVar1] != "scratch"[lVar1]) goto LAB_0016be44;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  iVar4 = 0;
LAB_0016be44:
  if (iVar4 == 0) {
    local_d0 = scratch->alloc_size;
  }
  else {
    (*error_callback->fn)("invalid scratch space",error_callback->data);
    local_d0 = 0;
  }
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  iVar7 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n_points != 0) {
    a = (secp256k1_gej *)secp256k1_scratch_alloc(error_callback,scratch,n_points << 7);
    na = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,n_points << 5);
    psVar2 = (secp256k1_fe *)secp256k1_scratch_alloc(error_callback,scratch,n_points * 0x140);
    local_a0.aux = psVar2;
    psVar3 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,n_points * 0x2c0);
    local_a0.pre_a = psVar3;
    local_a0.ps = (secp256k1_strauss_point_state *)
                  secp256k1_scratch_alloc(error_callback,scratch,n_points * 0x410);
    auVar9._0_4_ = -(uint)((int)((ulong)a >> 0x20) == 0 && (int)a == 0);
    auVar9._4_4_ = -(uint)((int)na == 0 && (int)((ulong)na >> 0x20) == 0);
    auVar9._8_4_ = -(uint)((int)((ulong)psVar2 >> 0x20) == 0 && (int)psVar2 == 0);
    auVar9._12_4_ = -(uint)((int)psVar3 == 0 && (int)((ulong)psVar3 >> 0x20) == 0);
    iVar4 = movmskps(iVar4,auVar9);
    iVar7 = 0;
    if (iVar4 == 0 && local_a0.ps != (secp256k1_strauss_point_state *)0x0) {
      if (n_points != 0) {
        piVar6 = &a->infinity;
        sVar5 = n_points;
        psVar8 = na;
        do {
          iVar4 = (*cb)(psVar8,&local_88,cb_offset,cbdata);
          if (iVar4 == 0) {
            secp256k1_scratch_apply_checkpoint(error_callback,scratch,local_d0);
            return 0;
          }
          *piVar6 = local_88.infinity;
          (((secp256k1_gej *)(piVar6 + -0x1e))->x).n[0] = local_88.x.n[0];
          *(uint64_t *)(piVar6 + -0x1c) = local_88.x.n[1];
          *(uint64_t *)(piVar6 + -0x1a) = local_88.x.n[2];
          *(uint64_t *)(piVar6 + -0x18) = local_88.x.n[3];
          *(uint64_t *)(piVar6 + -0x16) = local_88.x.n[4];
          ((secp256k1_fe *)(piVar6 + -0x14))->n[0] = local_88.y.n[0];
          *(uint64_t *)(piVar6 + -0x12) = local_88.y.n[1];
          *(uint64_t *)(piVar6 + -0x10) = local_88.y.n[2];
          *(uint64_t *)(piVar6 + -0xe) = local_88.y.n[3];
          *(uint64_t *)(piVar6 + -0xc) = local_88.y.n[4];
          ((secp256k1_fe *)(piVar6 + -10))->n[0] = 1;
          *(uint64_t *)(piVar6 + -8) = 0;
          *(uint64_t *)(piVar6 + -6) = 0;
          *(uint64_t *)(piVar6 + -4) = 0;
          *(uint64_t *)(piVar6 + -2) = 0;
          piVar6 = piVar6 + 0x20;
          cb_offset = cb_offset + 1;
          psVar8 = psVar8 + 1;
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
      }
      secp256k1_ecmult_strauss_wnaf(&local_a0,r,n_points,a,na,inp_g_sc);
      iVar7 = 1;
    }
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,local_d0);
  }
  return iVar7;
}

Assistant:

static int secp256k1_ecmult_strauss_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    secp256k1_gej* points;
    secp256k1_scalar* scalars;
    struct secp256k1_strauss_state state;
    size_t i;
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }

    /* We allocate STRAUSS_SCRATCH_OBJECTS objects on the scratch space. If these
     * allocations change, make sure to update the STRAUSS_SCRATCH_OBJECTS
     * constant and strauss_scratch_size accordingly. */
    points = (secp256k1_gej*)secp256k1_scratch_alloc(error_callback, scratch, n_points * sizeof(secp256k1_gej));
    scalars = (secp256k1_scalar*)secp256k1_scratch_alloc(error_callback, scratch, n_points * sizeof(secp256k1_scalar));
    state.aux = (secp256k1_fe*)secp256k1_scratch_alloc(error_callback, scratch, n_points * ECMULT_TABLE_SIZE(WINDOW_A) * sizeof(secp256k1_fe));
    state.pre_a = (secp256k1_ge*)secp256k1_scratch_alloc(error_callback, scratch, n_points * ECMULT_TABLE_SIZE(WINDOW_A) * sizeof(secp256k1_ge));
    state.ps = (struct secp256k1_strauss_point_state*)secp256k1_scratch_alloc(error_callback, scratch, n_points * sizeof(struct secp256k1_strauss_point_state));

    if (points == NULL || scalars == NULL || state.aux == NULL || state.pre_a == NULL || state.ps == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    for (i = 0; i < n_points; i++) {
        secp256k1_ge point;
        if (!cb(&scalars[i], &point, i+cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        secp256k1_gej_set_ge(&points[i], &point);
    }
    secp256k1_ecmult_strauss_wnaf(&state, r, n_points, points, scalars, inp_g_sc);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}